

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O2

bool __thiscall ON_SubDFace::GetQuadSurface(ON_SubDFace *this,ON_NurbsSurface *nurbs_surface)

{
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  uint i;
  long lVar4;
  bool bVar5;
  double dVar6;
  
  bVar5 = false;
  bVar3 = ON_NurbsSurface::Create(nurbs_surface,3,false,4,4,4,4);
  if (bVar3) {
    bVar3 = GetQuadSurface(this,nurbs_surface->m_cv,(long)nurbs_surface->m_cv_stride[0],
                           (long)nurbs_surface->m_cv_stride[1]);
    if (bVar3) {
      pdVar1 = nurbs_surface->m_knot[0];
      pdVar2 = nurbs_surface->m_knot[1];
      dVar6 = -2.0;
      for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
        pdVar2[lVar4] = dVar6;
        pdVar1[lVar4] = dVar6;
        dVar6 = dVar6 + 1.0;
      }
      bVar5 = true;
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool ON_SubDFace::GetQuadSurface(
class ON_NurbsSurface& nurbs_surface
  ) const
{
  if (false == nurbs_surface.Create(
    3, // dim
    false, // is_rat
    4, 4, // orders
    4, 4  // cv_counts
    ))
  {
    return false;
  }
  if (false == GetQuadSurface(nurbs_surface.m_cv, nurbs_surface.m_cv_stride[0], nurbs_surface.m_cv_stride[1]))
    return false;

  // evaluation domain will be [0,1] x [0,1]
  double k = -2.0;
  for (unsigned int i = 0; i < 6; i++)
  {
    nurbs_surface.m_knot[0][i] = nurbs_surface.m_knot[1][i] = k;
    k += 1.0;
  }

  return true;
}